

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void kj::copyContents(Directory *to,ReadableDirectory *from)

{
  PathPtr fromPath;
  PathPtr toPath;
  Entry *pEVar1;
  long lVar2;
  Path subPath;
  Array<kj::ReadableDirectory::Entry> local_48;
  
  (*(from->super_FsNode)._vptr_FsNode[7])(&local_48);
  pEVar1 = local_48.ptr;
  for (lVar2 = local_48.size_ << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
    Path::Path((Path *)&subPath.parts,&pEVar1->name);
    toPath.parts.size_ = subPath.parts.size_;
    toPath.parts.ptr = subPath.parts.ptr;
    fromPath.parts.size_ = subPath.parts.size_;
    fromPath.parts.ptr = subPath.parts.ptr;
    tryCopyDirectoryEntry(to,toPath,CREATE,from,fromPath,pEVar1->type,false);
    Array<kj::String>::~Array(&subPath.parts);
    pEVar1 = pEVar1 + 1;
  }
  Array<kj::ReadableDirectory::Entry>::~Array(&local_48);
  return;
}

Assistant:

static void copyContents(const Directory& to, const ReadableDirectory& from) {
  for (auto& entry: from.listEntries()) {
    Path subPath(kj::mv(entry.name));
    tryCopyDirectoryEntry(to, subPath, WriteMode::CREATE, from, subPath, entry.type, false);
  }
}